

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

string * __thiscall
soul::TokenType::getDescription_abi_cxx11_(string *__return_storage_ptr__,TokenType *this)

{
  char *__s;
  size_t sVar1;
  string local_48;
  
  __s = this->text;
  if (*__s == '$') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s + 1,__s + sVar1 + 1);
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar1);
    choc::text::addDoubleQuotes(__return_storage_ptr__,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getDescription() const
    {
        return text[0] == '$' ? std::string (text + 1)
                              : choc::text::addDoubleQuotes (text);
    }